

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::
MatchExpr<std::vector<int,_std::allocator<int>_>,_Catch::Matchers::Vector::ContainsMatcher<int,_std::allocator<int>,_std::allocator<int>_>_>
::MatchExpr(MatchExpr<std::vector<int,_std::allocator<int>_>,_Catch::Matchers::Vector::ContainsMatcher<int,_std::allocator<int>,_std::allocator<int>_>_>
            *this,vector<int,_std::allocator<int>_> *arg,
           ContainsMatcher<int,_std::allocator<int>,_std::allocator<int>_> *matcher,
           StringRef *matcherString)

{
  pointer pcVar1;
  size_type sVar2;
  int iVar3;
  
  iVar3 = (*(matcher->super_MatcherBase<std::vector<int,_std::allocator<int>_>_>).
            super_MatcherUntypedBase._vptr_MatcherUntypedBase[3])(matcher);
  (this->super_ITransientExpression).m_isBinaryExpression = true;
  (this->super_ITransientExpression).m_result = SUB41(iVar3,0);
  (this->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_00242ed8;
  this->m_arg = arg;
  (this->m_matcher).super_MatcherBase<std::vector<int,_std::allocator<int>_>_>.
  super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)&PTR__MatcherUntypedBase_0023f270;
  (this->m_matcher).super_MatcherBase<std::vector<int,_std::allocator<int>_>_>.
  super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p =
       (pointer)&(this->m_matcher).super_MatcherBase<std::vector<int,_std::allocator<int>_>_>.
                 super_MatcherUntypedBase.m_cachedToString.field_2;
  pcVar1 = (matcher->super_MatcherBase<std::vector<int,_std::allocator<int>_>_>).
           super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)
             &(this->m_matcher).super_MatcherBase<std::vector<int,_std::allocator<int>_>_>.
              super_MatcherUntypedBase.m_cachedToString,pcVar1,
             pcVar1 + (matcher->super_MatcherBase<std::vector<int,_std::allocator<int>_>_>).
                      super_MatcherUntypedBase.m_cachedToString._M_string_length);
  (this->m_matcher).super_MatcherBase<std::vector<int,_std::allocator<int>_>_>.
  super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)&PTR__MatcherUntypedBase_00242f18;
  (this->m_matcher).super_MatcherBase<std::vector<int,_std::allocator<int>_>_>.
  super_MatcherMethod<std::vector<int,_std::allocator<int>_>_>._vptr_MatcherMethod =
       (_func_int **)&DAT_00242f48;
  (this->m_matcher).m_comparator = matcher->m_comparator;
  sVar2 = matcherString->m_size;
  (this->m_matcherString).m_start = matcherString->m_start;
  (this->m_matcherString).m_size = sVar2;
  return;
}

Assistant:

MatchExpr( ArgT const& arg, MatcherT const& matcher, StringRef const& matcherString )
        :   ITransientExpression{ true, matcher.match( arg ) },
            m_arg( arg ),
            m_matcher( matcher ),
            m_matcherString( matcherString )
        {}